

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdarith.c
# Opt level: O2

boolean decode_mcu_DC_refine(j_decompress_ptr cinfo,JBLOCKROW *MCU_data)

{
  jpeg_entropy_decoder *pjVar1;
  JBLOCKROW paJVar2;
  jpeg_source_mgr *pjVar3;
  int iVar4;
  boolean bVar5;
  boolean bVar6;
  int bits_left;
  ulong uVar7;
  _func_void_j_decompress_ptr *get_buffer;
  long lVar8;
  bitread_working_state br_state;
  
  iVar4 = cinfo->Al;
  pjVar1 = cinfo->entropy;
  if (((cinfo->restart_interval == 0) || (*(int *)&pjVar1[3].decode_mcu != 0)) ||
     (bVar5 = process_restart(cinfo), bVar5 != 0)) {
    br_state.next_input_byte = cinfo->src->next_input_byte;
    br_state.bytes_in_buffer = cinfo->src->bytes_in_buffer;
    get_buffer = pjVar1[1].start_pass;
    uVar7 = (ulong)*(uint *)&pjVar1[1].decode_mcu;
    bVar5 = 1;
    br_state.cinfo = cinfo;
    for (lVar8 = 0; bits_left = (int)uVar7, lVar8 < cinfo->blocks_in_MCU; lVar8 = lVar8 + 1) {
      paJVar2 = MCU_data[lVar8];
      if ((bits_left < 1) &&
         (bVar6 = jpeg_fill_bit_buffer(&br_state,(bit_buf_type)get_buffer,bits_left,1),
         get_buffer = (_func_void_j_decompress_ptr *)br_state.get_buffer,
         bits_left = br_state.bits_left, bVar6 == 0)) goto LAB_0023ea7b;
      uVar7 = (ulong)(bits_left - 1);
      if (((ulong)get_buffer >> (uVar7 & 0x3f) & 1) != 0) {
        (*paJVar2)[0] = (*paJVar2)[0] | (ushort)(1 << ((byte)iVar4 & 0x1f));
      }
    }
    pjVar3 = cinfo->src;
    pjVar3->next_input_byte = br_state.next_input_byte;
    pjVar3->bytes_in_buffer = br_state.bytes_in_buffer;
    pjVar1[1].start_pass = get_buffer;
    *(int *)&pjVar1[1].decode_mcu = bits_left;
    *(int *)&pjVar1[3].decode_mcu = *(int *)&pjVar1[3].decode_mcu + -1;
  }
  else {
LAB_0023ea7b:
    bVar5 = 0;
  }
  return bVar5;
}

Assistant:

METHODDEF(boolean)
decode_mcu_DC_refine (j_decompress_ptr cinfo, JBLOCKROW *MCU_data)
{
  arith_entropy_ptr entropy = (arith_entropy_ptr) cinfo->entropy;
  unsigned char *st;
  int p1, blkn;

  /* Process restart marker if needed */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0)
      process_restart(cinfo);
    entropy->restarts_to_go--;
  }

  st = entropy->fixed_bin;	/* use fixed probability estimation */
  p1 = 1 << cinfo->Al;		/* 1 in the bit position being coded */

  /* Outer loop handles each block in the MCU */

  for (blkn = 0; blkn < cinfo->blocks_in_MCU; blkn++) {
    /* Encoded data is simply the next bit of the two's-complement DC value */
    if (arith_decode(cinfo, st))
      MCU_data[blkn][0][0] |= p1;
  }

  return TRUE;
}